

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O1

Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::httpClientConnect(anon_unknown_0 *this,AsyncIoContext *io)

{
  Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *this_00;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *promise;
  PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *__return_storage_ptr__;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *promise_00;
  PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *__return_storage_ptr___00;
  long *plVar1;
  PromiseArenaMember *pPVar2;
  SourceLocation location;
  bool bVar3;
  int iVar4;
  coroutine_handle<void> coroutine;
  undefined4 extraout_var;
  Own<kj::NetworkAddress,_std::nullptr_t> OVar5;
  
  coroutine._M_fr_ptr = operator_new(0x5f8);
  *(code **)coroutine._M_fr_ptr = httpClientConnect;
  *(code **)((long)coroutine._M_fr_ptr + 8) = httpClientConnect;
  this_00 = (Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
            ((long)coroutine._M_fr_ptr + 0x10);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062ded0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062df18;
  location.function = "httpClientConnect";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
  ;
  location.lineNumber = 0x1d5;
  location.columnNumber = 0x1d;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062ded0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062df18;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
  *(Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> **)this = this_00;
  iVar4 = (*((io->provider).ptr)->_vptr_AsyncIoProvider[3])();
  promise = (Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)
            ((long)coroutine._M_fr_ptr + 0x5e0);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar4))
            (promise,(undefined8 *)CONCAT44(extraout_var,iVar4),"capnproto.org",0xe,0x50);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)
       ((long)coroutine._M_fr_ptr + 0x240);
  co_await<kj::Own<kj::NetworkAddress,decltype(nullptr)>>(__return_storage_ptr__,promise);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 0;
  bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar3) {
    OVar5 = kj::_::PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::await_resume
                      ((PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)
                       ((long)coroutine._M_fr_ptr + 0x5c0));
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x3f8);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f8) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x3f0))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x3f0),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10),OVar5.ptr);
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 600) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x260));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    pPVar2 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar2);
    }
    promise_00 = (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
                 ((long)coroutine._M_fr_ptr + 0x5e8);
    (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x5c8))(promise_00);
    __return_storage_ptr___00 =
         (PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
         ((long)coroutine._M_fr_ptr + 0x400);
    co_await<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>(__return_storage_ptr___00,promise_00);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 1;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
    if (!bVar3) {
      kj::_::PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::await_resume
                ((PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
                 ((long)coroutine._M_fr_ptr + 0x5d0));
      kj::_::Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::fulfill
                (this_00,(FixVoid<kj::Own<kj::AsyncIoStream>_> *)((long)coroutine._M_fr_ptr + 0x5d0)
                );
      plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x5d8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5d8) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x5d0))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x5d0),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x5b8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5b8) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x5b0))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x5b0),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      if (*(char *)((long)coroutine._M_fr_ptr + 0x418) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x420));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase
                ((PromiseAwaiterBase *)__return_storage_ptr___00);
      pPVar2 = &((promise_00->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      if (pPVar2 != (PromiseArenaMember *)0x0) {
        (promise_00->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar2);
      }
      plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x5c8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5c8) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x5c0))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x5c0),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      *(undefined8 *)coroutine._M_fr_ptr = 0;
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 2;
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<AsyncIoStream>> httpClientConnect(AsyncIoContext& io) {
  auto addr = co_await io.provider->getNetwork().parseAddress("capnproto.org", 80);
  co_return co_await addr->connect();
}